

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O0

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,Name *h,DataKey *info)

{
  int iVar1;
  int iVar2;
  Element<soplex::NameSet::Name,_soplex::DataKey> *pEVar3;
  DataKey *in_RDX;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  *in_RSI;
  long in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_stack_00000010;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  *in_stack_ffffffffffffffc0;
  
  iVar1 = *(int *)(in_RDI + 0x1c);
  iVar2 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
          ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                  *)0x19e67d);
  if ((double)iVar2 * 0.7 <= (double)iVar1) {
    reMax(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  }
  (**(code **)(in_RDI + 0x20))(in_RSI);
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
          *)0x19e6d8);
  while( true ) {
    pEVar3 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
             ::operator[](in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20))
    ;
    if (pEVar3->stat != USED) break;
    Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
    ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
            *)0x19e710);
  }
  pEVar3 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
           ::operator[](in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  pEVar3->stat = USED;
  pEVar3 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
           ::operator[](in_stack_ffffffffffffffc0,(int)((ulong)in_RDX >> 0x20));
  pEVar3->info = *in_RDX;
  pEVar3 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
           ::operator[](in_RSI,(int)((ulong)in_RDX >> 0x20));
  NameSet::Name::operator=(&pEVar3->item,(Name *)in_RSI);
  *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
  return;
}

Assistant:

void add(const HashItem& h, const Info& info)
   {
      assert(!has(h));

      if(m_used >= m_elem.size() * SOPLEX_HASHTABLE_FILLFACTOR)
         reMax(int(m_memfactor * m_used) + 1);

      assert(m_used < m_elem.size());

      decltype(m_elem.size()) i;

      for(i = (*m_hashfun)(&h) % m_elem.size();
            m_elem[i].stat == Elem::USED;
            i = (i + m_hashsize) % m_elem.size())
         ;

      assert(m_elem[i].stat != Elem::USED);

      m_elem[i].stat = Elem::USED;
      m_elem[i].info = info;
      m_elem[i].item = h;

      m_used++;

      assert(has(h));
   }